

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

int cimg_library::cimg::fwrite<unsigned_char>(uchar *ptr,uint nmemb,FILE *stream)

{
  int iVar1;
  size_t sVar2;
  CImgArgumentException *this;
  uint uVar3;
  uint uVar5;
  char *pcVar6;
  size_t __n;
  ulong uVar4;
  
  uVar4 = (ulong)nmemb;
  if ((ptr != (uchar *)0x0) && (stream != (FILE *)0x0)) {
    uVar5 = 0;
    if (nmemb != 0) {
      do {
        __n = 0x3f00000;
        if ((uint)uVar4 < 0x3f00000) {
          __n = uVar4;
        }
        sVar2 = fwrite(ptr + uVar5,1,__n,(FILE *)stream);
        iVar1 = (int)sVar2;
        uVar5 = uVar5 + iVar1;
        uVar3 = (uint)uVar4 - iVar1;
        uVar4 = (ulong)uVar3;
      } while (((int)__n == iVar1) && (uVar3 != 0));
      if (uVar3 != 0) {
        warn("cimg::fwrite() : Only %u/%u elements could be written in file.",(ulong)uVar5,
             (ulong)nmemb);
      }
    }
    return uVar5;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  pcVar6 = "";
  if (1 < nmemb) {
    pcVar6 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fwrite() : Invalid writing request of %u %s%s from buffer %p to file %p.",
             uVar4,"unsigned char",pcVar6,ptr,stream);
  __cxa_throw(this,&CImgArgumentException::typeinfo,std::exception::~exception);
}

Assistant:

inline int fwrite(const T *ptr, const unsigned int nmemb, std::FILE *stream) {
      if (!ptr || !stream)
        throw CImgArgumentException("cimg::fwrite() : Invalid writing request of %u %s%s from buffer %p to file %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",ptr,stream);
      if (nmemb<=0) return 0;
      const unsigned long wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      unsigned int to_write = nmemb, al_write = 0, l_to_write = 0, l_al_write = 0;
      do {
        l_to_write = (to_write*sizeof(T))<wlimitT?to_write:wlimit;
        l_al_write = (unsigned int)std::fwrite((void*)(ptr+al_write),sizeof(T),l_to_write,stream);
        al_write+=l_al_write;
        to_write-=l_al_write;
      } while (l_to_write==l_al_write && to_write>0);
      if (to_write>0)
        warn("cimg::fwrite() : Only %u/%u elements could be written in file.",
             al_write,nmemb);
      return al_write;
    }